

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectwriter.cc
# Opt level: O2

void __thiscall
google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::AnyWriter
          (AnyWriter *this,ProtoStreamObjectWriter *parent)

{
  this->parent_ = parent;
  (this->ow_)._M_t.
  super___uniq_ptr_impl<google::protobuf::util::converter::ProtoStreamObjectWriter,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
  .super__Head_base<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_false>.
  _M_head_impl = (ProtoStreamObjectWriter *)0x0;
  (this->type_url_)._M_dataplus._M_p = (pointer)&(this->type_url_).field_2;
  (this->type_url_)._M_string_length = 0;
  (this->type_url_).field_2._M_local_buf[0] = '\0';
  this->invalid_ = false;
  (this->data_)._M_dataplus._M_p = (pointer)&(this->data_).field_2;
  (this->data_)._M_string_length = 0;
  (this->data_).field_2._M_local_buf[0] = '\0';
  (this->output_).super_ByteSink._vptr_ByteSink = (_func_int **)&PTR__ByteSink_003df3e8;
  (this->output_).dest_ = &this->data_;
  this->depth_ = 0;
  this->is_well_known_type_ = false;
  this->well_known_type_render_ = (TypeRenderer *)0x0;
  (this->uninterpreted_events_).
  super__Vector_base<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event,_std::allocator<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->uninterpreted_events_).
  super__Vector_base<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event,_std::allocator<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->uninterpreted_events_).
  super__Vector_base<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event,_std::allocator<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

ProtoStreamObjectWriter::AnyWriter::AnyWriter(ProtoStreamObjectWriter* parent)
    : parent_(parent),
      ow_(),
      invalid_(false),
      data_(),
      output_(&data_),
      depth_(0),
      is_well_known_type_(false),
      well_known_type_render_(nullptr) {}